

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O3

int jpeg_quality_scaling(int quality)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 1;
  if (1 < quality) {
    uVar1 = quality;
  }
  uVar2 = 100;
  if ((int)uVar1 < 100) {
    uVar2 = uVar1;
  }
  if (quality < 0x32) {
    return 5000 / (uVar2 & 0xffff);
  }
  return uVar2 * -2 + 200;
}

Assistant:

GLOBAL(int)
jpeg_quality_scaling (int quality)
/* Convert a user-specified quality rating to a percentage scaling factor
 * for an underlying quantization table, using our recommended scaling curve.
 * The input 'quality' factor should be 0 (terrible) to 100 (very good).
 */
{
  /* Safety limit on quality factor.  Convert 0 to 1 to avoid zero divide. */
  if (quality <= 0) quality = 1;
  if (quality > 100) quality = 100;

  /* The basic table is used as-is (scaling 100) for a quality of 50.
   * Qualities 50..100 are converted to scaling percentage 200 - 2*Q;
   * note that at Q=100 the scaling is 0, which will cause jpeg_add_quant_table
   * to make all the table entries 1 (hence, minimum quantization loss).
   * Qualities 1..50 are converted to scaling percentage 5000/Q.
   */
  if (quality < 50)
    quality = 5000 / quality;
  else
    quality = 200 - quality*2;

  return quality;
}